

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O0

void tok_wfinish(TokenizerW *tok)

{
  size_t sVar1;
  wchar_t *pwVar2;
  TokenizerW *tok_local;
  
  *tok->wptr = L'\0';
  if (((tok->flags & 1U) != 0) || (tok->wptr != tok->wstart)) {
    sVar1 = tok->argc;
    tok->argc = sVar1 + 1;
    tok->argv[sVar1] = tok->wstart;
    tok->argv[tok->argc] = (wchar_t *)0x0;
    pwVar2 = tok->wptr;
    tok->wptr = pwVar2 + 1;
    tok->wstart = pwVar2 + 1;
  }
  tok->flags = tok->flags & 0xfffffffe;
  return;
}

Assistant:

static void
FUN(tok,finish)(TYPE(Tokenizer) *tok)
{

	*tok->wptr = '\0';
	if ((tok->flags & TOK_KEEP) || tok->wptr != tok->wstart) {
		tok->argv[tok->argc++] = tok->wstart;
		tok->argv[tok->argc] = NULL;
		tok->wstart = ++tok->wptr;
	}
	tok->flags &= ~TOK_KEEP;
}